

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O1

bool __thiscall
stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::
executeThread(MicrothreadManager<implementations::brainfck::BFImplementation> *this,
             _threads_iterator thread)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  
  (this->current_thread)._M_node = thread._M_node;
  iVar5 = *(int *)&thread._M_node[2]._M_parent;
  if ((iVar5 == 0) || (bVar1 = shouldRunThread(this,thread), !bVar1)) {
    bVar1 = false;
  }
  else {
    bVar4 = false;
    do {
      cVar2 = (*(code *)(thread._M_node[1]._M_parent)->_M_left)(&thread._M_node[1]._M_parent);
      if (cVar2 == '\0') {
        return bVar4;
      }
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        return true;
      }
      bVar3 = shouldRunThread(this,thread);
      bVar4 = true;
      bVar1 = true;
    } while (bVar3);
  }
  return bVar1;
}

Assistant:

bool executeThread(_threads_iterator thread) {
				current_thread = thread;
				bool executed = false;
				for (CycleCount cycle = thread->second.cycles; cycle > 0; --cycle) {
					if (shouldRunThread(thread) == false)
						return executed;
					if (!thread->second.execute())
						return executed;
					executed = true;
				}
				return executed;
			}